

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O2

int asmjit::rbAssert(RbNode *root)

{
  RbNode *root_00;
  RbNode *root_01;
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (root == (RbNode *)0x0) {
    iVar3 = 1;
  }
  else {
    root_00 = root->node[0];
    root_01 = root->node[1];
    if ((root->red != 0) &&
       (((root_00 != (RbNode *)0x0 && (root_00->red != 0)) ||
        ((root_01 != (RbNode *)0x0 && (root_01->red != 0)))))) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/vmem.cpp"
                 ,0x8a,"!(rbIsRed(root) && (rbIsRed(ln) || rbIsRed(rn)))");
    }
    iVar1 = rbAssert(root_00);
    iVar2 = rbAssert(root_01);
    if ((root_00 != (RbNode *)0x0) && (root->mem <= root_00->mem)) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/vmem.cpp"
                 ,0x90,"ln == nullptr || ln->mem < root->mem");
    }
    if ((root_01 != (RbNode *)0x0) && (root_01->mem <= root->mem)) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/vmem.cpp"
                 ,0x91,"rn == nullptr || rn->mem > root->mem");
    }
    if (iVar1 != iVar2 && (iVar2 != 0 && iVar1 != 0)) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/vmem.cpp"
                 ,0x94,"!(lh != 0 && rh != 0 && lh != rh)");
    }
    iVar3 = 0;
    if (iVar2 != 0 && iVar1 != 0) {
      iVar3 = iVar1 + (uint)(root->red == 0);
    }
  }
  return iVar3;
}

Assistant:

static int rbAssert(RbNode* root) noexcept {
  if (!root) return 1;

  RbNode* ln = root->node[0];
  RbNode* rn = root->node[1];

  // Red violation.
  ASMJIT_ASSERT(!(rbIsRed(root) && (rbIsRed(ln) || rbIsRed(rn))));

  int lh = rbAssert(ln);
  int rh = rbAssert(rn);

  // Invalid btree.
  ASMJIT_ASSERT(ln == nullptr || ln->mem < root->mem);
  ASMJIT_ASSERT(rn == nullptr || rn->mem > root->mem);

  // Black violation.
  ASMJIT_ASSERT(!(lh != 0 && rh != 0 && lh != rh));

  // Only count black links.
  if (lh != 0 && rh != 0)
    return rbIsRed(root) ? lh : lh + 1;
  else
    return 0;
}